

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O2

int string2ll(char *s,size_t slen,longlong *value)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (slen == 0) {
    return -1;
  }
  cVar1 = *s;
  if (slen == 1) {
    if (cVar1 == '-') {
      return -1;
    }
    if (cVar1 != '0') {
LAB_00107a09:
      uVar3 = 1;
      bVar2 = false;
      goto LAB_00107a16;
    }
    if (value == (longlong *)0x0) {
      return 0;
    }
  }
  else {
    if (cVar1 != '-') goto LAB_00107a09;
    cVar1 = s[1];
    s = s + 1;
    uVar3 = 2;
    bVar2 = true;
LAB_00107a16:
    if ((byte)(cVar1 - 0x31U) < 9) {
      uVar6 = (ulong)(byte)(cVar1 - 0x30);
      for (; s = s + 1, uVar3 < slen; uVar3 = uVar3 + 1) {
        if ((byte)(*s - 0x3aU) < 0xf6) {
          return -1;
        }
        if (0x1999999999999999 < uVar6) {
          return -1;
        }
        uVar4 = uVar6 * 10;
        uVar5 = (ulong)(byte)(*s - 0x30);
        uVar6 = uVar5 + uVar4;
        if (CARRY8(uVar5,uVar4)) {
          return -1;
        }
      }
      if (bVar2) {
        if (0x8000000000000000 < uVar6) {
          return -1;
        }
        if (value == (longlong *)0x0) {
          return 0;
        }
        uVar6 = -uVar6;
      }
      else {
        if ((long)uVar6 < 0) {
          return -1;
        }
        if (value == (longlong *)0x0) {
          return 0;
        }
      }
      goto LAB_00107a7b;
    }
    if (slen != 1 || cVar1 != '0') {
      return -1;
    }
  }
  uVar6 = 0;
LAB_00107a7b:
  *value = uVar6;
  return 0;
}

Assistant:

static int string2ll(const char *s, size_t slen, long long *value) {
    const char *p = s;
    size_t plen = 0;
    int negative = 0;
    unsigned long long v;

    if (plen == slen)
        return REDIS_ERR;

    /* Special case: first and only digit is 0. */
    if (slen == 1 && p[0] == '0') {
        if (value != NULL) *value = 0;
        return REDIS_OK;
    }

    if (p[0] == '-') {
        negative = 1;
        p++; plen++;

        /* Abort on only a negative sign. */
        if (plen == slen)
            return REDIS_ERR;
    }

    /* First digit should be 1-9, otherwise the string should just be 0. */
    if (p[0] >= '1' && p[0] <= '9') {
        v = p[0]-'0';
        p++; plen++;
    } else if (p[0] == '0' && slen == 1) {
        *value = 0;
        return REDIS_OK;
    } else {
        return REDIS_ERR;
    }

    while (plen < slen && p[0] >= '0' && p[0] <= '9') {
        if (v > (ULLONG_MAX / 10)) /* Overflow. */
            return REDIS_ERR;
        v *= 10;

        if (v > (ULLONG_MAX - (p[0]-'0'))) /* Overflow. */
            return REDIS_ERR;
        v += p[0]-'0';

        p++; plen++;
    }

    /* Return if not all bytes were used. */
    if (plen < slen)
        return REDIS_ERR;

    if (negative) {
        if (v > ((unsigned long long)(-(LLONG_MIN+1))+1)) /* Overflow. */
            return REDIS_ERR;
        if (value != NULL) *value = -v;
    } else {
        if (v > LLONG_MAX) /* Overflow. */
            return REDIS_ERR;
        if (value != NULL) *value = v;
    }
    return REDIS_OK;
}